

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cDrawIndirectTests.cpp
# Opt level: O3

long __thiscall
glcts::anon_unknown_0::CBufferFlushMappedRange<glcts::(anonymous_namespace)::test_api::ES3>::Run
          (CBufferFlushMappedRange<glcts::(anonymous_namespace)::test_api::ES3> *this)

{
  CallLogWrapper *pCVar1;
  pointer *this_00;
  GLboolean GVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar4;
  void *pvVar5;
  void *__src;
  uint uVar6;
  uint widthRef;
  DILogger *this_01;
  uint in_R9D;
  uint uVar7;
  size_t sVar8;
  long lVar9;
  uint sizeX;
  ulong uVar10;
  uint in_stack_fffffffffffff368;
  allocator_type local_c89;
  CallLogWrapper *local_c88;
  ulong local_c80;
  CDataArray dataRef;
  CDataArray dataRef2;
  value_type_conflict4 local_c3c;
  CDataArray dataTest;
  DIResult result;
  DILogger local_930;
  DILogger local_7b0;
  DILogger local_630;
  DILogger local_4b0;
  DILogger local_330;
  DILogger local_1b0;
  
  result.logger_.null_log_ = false;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&result.logger_.str_);
  result.status_ = 0;
  pCVar1 = &(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glGenBuffers(pCVar1,1,&this->_buffer);
  glu::CallLogWrapper::glBindBuffer(pCVar1,0x8f3f,this->_buffer);
  dataRef.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  dataRef.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  dataRef.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar3 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
            m_renderCtx->_vptr_RenderContext[4])();
  uVar6 = 0x4000;
  if ((int)*(uint *)CONCAT44(extraout_var,iVar3) < 0x4000) {
    uVar6 = *(uint *)CONCAT44(extraout_var,iVar3);
  }
  iVar3 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
            m_renderCtx->_vptr_RenderContext[4])();
  uVar7 = *(uint *)(CONCAT44(extraout_var_00,iVar3) + 4);
  uVar10 = (ulong)uVar7;
  if ((int)(0x10000 / (long)(int)uVar6) < (int)uVar7) {
    uVar10 = 0x10000 / (long)(int)uVar6 & 0xffffffff;
  }
  sizeX = (uint)uVar10;
  DrawIndirectBase::DataGen<unsigned_int>
            ((DrawIndirectBase *)&dataRef,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(ulong)uVar6,sizeX,1,1000,in_R9D
            );
  dataRef2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  dataRef2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  dataRef2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  DrawIndirectBase::DataGen<unsigned_int>
            ((DrawIndirectBase *)&dataRef2,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(ulong)uVar6,sizeX,1000,2000,
             in_R9D);
  uVar7 = sizeX + 3;
  if (-1 < (int)sizeX) {
    uVar7 = sizeX;
  }
  local_c88 = pCVar1;
  glu::CallLogWrapper::glBufferData
            (pCVar1,0x8f3f,
             (long)dataRef.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)dataRef.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start,
             dataRef.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start,0x88e8);
  lVar4 = DrawIndirectBase::StateValidate<glcts::(anonymous_namespace)::test_api::ES3>
                    (&this->super_DrawIndirectBase,'\0',0x88ba,0,0,0);
  DIResult::sub_result(&local_1b0,&result,lVar4);
  widthRef = (int)((int)(uVar10 >> 0x1f) + sizeX) >> 1;
  local_c80 = (ulong)(uint)((int)uVar7 >> 2);
  DILogger::~DILogger(&local_1b0);
  lVar4 = (long)(int)(((int)uVar7 >> 2) * uVar6);
  lVar9 = lVar4 * 4;
  sVar8 = (long)(int)(widthRef * uVar6) << 2;
  pvVar5 = glu::CallLogWrapper::glMapBufferRange(local_c88,0x8f3f,lVar9,sVar8,0x12);
  if (pvVar5 == (void *)0x0) {
    result.status_ = -1;
    dataTest.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = '\0';
    std::__cxx11::ostringstream::ostringstream
              ((ostringstream *)
               &dataTest.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish);
    glcts::(anonymous_namespace)::DILogger::operator<<
              ((DILogger *)&dataTest,
               (char (*) [74])
               "glMapBufferRange(GL_DRAW_INDIRECT_BUFFER, GL_MAP_WRITE_BIT) returned NULL");
    this_01 = (DILogger *)&dataTest;
  }
  else {
    lVar9 = DrawIndirectBase::StateValidate<glcts::(anonymous_namespace)::test_api::ES3>
                      (&this->super_DrawIndirectBase,'\x01',0x88b9,0x12,lVar9,sVar8);
    DIResult::sub_result(&local_330,&result,lVar9);
    DILogger::~DILogger(&local_330);
    memcpy(pvVar5,dataRef2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start + lVar4,sVar8);
    glu::CallLogWrapper::glFlushMappedBufferRange(local_c88,0x8f3f,0,sVar8);
    GVar2 = glu::CallLogWrapper::glUnmapBuffer(local_c88,0x8f3f);
    if (GVar2 == '\0') {
      result.status_ = -1;
      this_00 = &dataTest.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      dataTest.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start._0_1_ = '\0';
      std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
      if ((char)dataTest.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start == '\0') {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00,
                   "glUnmapBuffer(GL_DRAW_INDIRECT_BUFFER) returned GL_FALSE, expected GL_TRUE",0x4a
                  );
      }
      DILogger::~DILogger((DILogger *)&dataTest);
    }
    lVar4 = DrawIndirectBase::StateValidate<glcts::(anonymous_namespace)::test_api::ES3>
                      (&this->super_DrawIndirectBase,'\0',0x88ba,0,0,0);
    DIResult::sub_result(&local_4b0,&result,lVar4);
    this_01 = &local_4b0;
  }
  DILogger::~DILogger(this_01);
  local_c3c = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&dataTest,(long)(int)(sizeX * uVar6),&local_c3c,&local_c89);
  pCVar1 = local_c88;
  pvVar5 = (void *)CONCAT71(dataTest.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start._1_7_,
                            (char)dataTest.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
  sVar8 = (long)dataTest.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pvVar5;
  __src = glu::CallLogWrapper::glMapBufferRange(local_c88,0x8f3f,0,sVar8,1);
  memcpy(pvVar5,__src,sVar8);
  glu::CallLogWrapper::glUnmapBuffer(pCVar1,0x8f3f);
  lVar4 = DrawIndirectBase::DataCompare<unsigned_int>
                    ((DrawIndirectBase *)&dataRef,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(ulong)uVar6,
                     (uint)local_c80,(uint)&dataTest,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(ulong)uVar6,
                     (uint)local_c80,0,0,in_stack_fffffffffffff368);
  DIResult::sub_result(&local_630,&result,lVar4);
  DILogger::~DILogger(&local_630);
  lVar4 = DrawIndirectBase::DataCompare<unsigned_int>
                    ((DrawIndirectBase *)&dataRef2,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(ulong)uVar6,widthRef,
                     (uint)&dataTest,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(ulong)uVar6,widthRef,
                     (uint)local_c80,(uint)local_c80,in_stack_fffffffffffff368);
  DIResult::sub_result(&local_7b0,&result,lVar4);
  DILogger::~DILogger(&local_7b0);
  iVar3 = sizeX * 3 + 3;
  if (-1 < (int)(sizeX * 3)) {
    iVar3 = sizeX * 3;
  }
  lVar4 = DrawIndirectBase::DataCompare<unsigned_int>
                    ((DrawIndirectBase *)&dataRef,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(ulong)uVar6,
                     (uint)local_c80,(uint)&dataTest,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(ulong)uVar6,
                     (uint)local_c80,iVar3 >> 2,iVar3 >> 2,in_stack_fffffffffffff368);
  DIResult::sub_result(&local_930,&result,lVar4);
  DILogger::~DILogger(&local_930);
  lVar4 = result.status_;
  pvVar5 = (void *)CONCAT71(dataTest.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start._1_7_,
                            (char)dataTest.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
  if (pvVar5 != (void *)0x0) {
    operator_delete(pvVar5,(long)dataTest.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar5);
  }
  if (dataRef2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(dataRef2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)dataRef2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)dataRef2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (dataRef.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(dataRef.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)dataRef.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)dataRef.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  DILogger::~DILogger(&result.logger_);
  return lVar4;
}

Assistant:

virtual long Run()
	{
		DIResult result;

		glGenBuffers(1, &_buffer);
		glBindBuffer(GL_DRAW_INDIRECT_BUFFER, _buffer);

		CDataArray dataRef;
		int		   dataWidth, dataHeight;
		getDataSize(dataWidth, dataHeight);
		DataGen<unsigned int>(dataRef, dataWidth, dataHeight, 1, 1000);

		CDataArray dataRef2;
		DataGen<unsigned int>(dataRef2, dataWidth, dataHeight, 1000, 2000);

		const int halfSize	= dataHeight / 2 * dataWidth;
		const int quarterSize = dataHeight / 4 * dataWidth;

		glBufferData(GL_DRAW_INDIRECT_BUFFER, (GLsizeiptr)(dataRef.size() * sizeof(unsigned int)), &dataRef[0],
					 GL_DYNAMIC_DRAW);

		result.sub_result(StateValidate<api>(GL_FALSE, GL_READ_WRITE, 0, 0, 0));

		void* buf = glMapBufferRange(GL_DRAW_INDIRECT_BUFFER, quarterSize * sizeof(unsigned int),
									 halfSize * sizeof(unsigned int), GL_MAP_WRITE_BIT | GL_MAP_FLUSH_EXPLICIT_BIT);

		if (buf == 0)
		{
			result.error() << "glMapBufferRange(GL_DRAW_INDIRECT_BUFFER, GL_MAP_WRITE_BIT) returned NULL";
		}

		if (buf)
		{
			result.sub_result(StateValidate<api>(GL_TRUE, GL_WRITE_ONLY, GL_MAP_WRITE_BIT | GL_MAP_FLUSH_EXPLICIT_BIT,
												 quarterSize * sizeof(unsigned int), halfSize * sizeof(unsigned int)));

			memcpy(buf, &dataRef2[quarterSize], halfSize * sizeof(unsigned int));
			glFlushMappedBufferRange(GL_DRAW_INDIRECT_BUFFER, 0, halfSize * sizeof(unsigned int));

			if (glUnmapBuffer(GL_DRAW_INDIRECT_BUFFER) == GL_FALSE)
			{
				result.error() << "glUnmapBuffer(GL_DRAW_INDIRECT_BUFFER) returned GL_FALSE, expected GL_TRUE";
			}
			buf = 0;

			result.sub_result(StateValidate<api>(GL_FALSE, GL_READ_WRITE, 0, 0, 0));
		}

		CDataArray dataTest(dataWidth * dataHeight, 0);
		GetBufferSubData<api>(GL_DRAW_INDIRECT_BUFFER, 0, (GLsizeiptr)(dataTest.size() * sizeof(unsigned int)),
							  &dataTest[0]);

		result.sub_result(DataCompare(dataRef, dataWidth, dataHeight / 4, dataTest, dataWidth, dataHeight / 4));

		result.sub_result(DataCompare(dataRef2, dataWidth, dataHeight / 2, dataTest, dataWidth, dataHeight / 2,
									  dataHeight / 4, dataHeight / 4));

		result.sub_result(DataCompare(dataRef, dataWidth, dataHeight / 4, dataTest, dataWidth, dataHeight / 4,
									  dataHeight * 3 / 4, dataHeight * 3 / 4));

		return result.code();
	}